

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

string * __thiscall
glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
          (string *__return_storage_ptr__,DrawIndirectBase *this,GLboolean value)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)this == 1) {
    pcVar1 = "mapped_ == GL_TRUE";
    pcVar2 = "";
  }
  else {
    pcVar1 = "mapped_ == GL_FALSE";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1 + 0xb,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string BoolToString(GLboolean value)
	{
		if (value == GL_TRUE)
			return "GL_TRUE";

		return "GL_FALSE";
	}